

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t attr_init(exr_context_t ctxt,exr_attribute_t *nattr)

{
  undefined8 *puVar1;
  long in_RSI;
  long in_RDI;
  exr_attr_opaquedata_t nil_22;
  exr_attr_v3d_t nil_21;
  exr_attr_v3f_t nil_20;
  exr_attr_v3i_t nil_19;
  exr_attr_v2d_t nil_18;
  exr_attr_v2f_t nil_17;
  exr_attr_v2i_t nil_16;
  exr_attr_timecode_t nil_15;
  exr_attr_tiledesc_t nil_14;
  exr_attr_string_vector_t nil_13;
  exr_attr_string_t nil_12;
  exr_attr_rational_t nil_11;
  exr_attr_preview_t nil_10;
  exr_attr_m44f_t nil_9;
  exr_attr_m44f_t nil_8;
  exr_attr_m33d_t nil_7;
  exr_attr_m33f_t nil_6;
  exr_attr_keycode_t nil_5;
  exr_attr_float_vector_t nil_4;
  exr_attr_chromaticities_t nil_3;
  exr_attr_chlist_t nil_2;
  exr_attr_box2f_t nil_1;
  exr_attr_box2i_t nil;
  undefined1 local_260 [63];
  undefined8 local_221;
  undefined8 local_219;
  undefined8 local_211;
  undefined8 local_209;
  undefined4 local_201;
  undefined8 local_1fd;
  undefined4 local_1f5;
  undefined8 local_1f1;
  undefined8 local_1e9;
  undefined8 local_1e1;
  undefined8 local_1d9;
  undefined8 local_1d1;
  undefined8 local_1c9;
  undefined1 local_1c1;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [72];
  undefined1 local_b8 [36];
  undefined8 local_94;
  undefined8 local_8c;
  undefined8 local_84;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = in_RSI;
  switch(*(undefined4 *)(in_RSI + 0x14)) {
  case 0:
  case 0x1f:
  default:
    if (in_RDI != 0) {
      (**(code **)(in_RDI + 0x48))
                (in_RDI,3,"Invalid / unimplemented type (%s) in attr_init",
                 *(undefined8 *)(in_RSI + 8));
    }
    return 3;
  case 1:
    memset(&local_28,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_28;
    puVar1[1] = local_20;
    break;
  case 2:
    memset(&local_38,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_38;
    puVar1[1] = local_30;
    break;
  case 3:
    memset(&local_48,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_48;
    puVar1[1] = local_40;
    break;
  case 4:
    memset(&local_68,0,0x20);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_68;
    puVar1[1] = local_60;
    puVar1[2] = local_58;
    puVar1[3] = local_50;
    break;
  case 5:
  case 7:
  case 0xc:
  case 0x1d:
    *(undefined1 *)(in_RSI + 0x18) = 0;
    break;
  case 6:
    *(undefined8 *)(in_RSI + 0x18) = 0;
    break;
  case 8:
    *(undefined4 *)(in_RSI + 0x18) = 0;
    break;
  case 9:
    memset(&local_78,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_78;
    puVar1[1] = local_70;
    break;
  case 10:
    *(undefined4 *)(in_RSI + 0x18) = 0;
    break;
  case 0xb:
    memset(&local_94,0,0x1c);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_94;
    puVar1[1] = local_8c;
    puVar1[2] = local_84;
    *(undefined4 *)(puVar1 + 3) = local_7c;
    break;
  case 0xd:
    memset(local_b8,0,0x24);
    memcpy(*(void **)(local_18 + 0x18),local_b8,0x24);
    break;
  case 0xe:
    memset(local_100,0,0x48);
    memcpy(*(void **)(local_18 + 0x18),local_100,0x48);
    break;
  case 0xf:
    memset(local_140,0,0x40);
    memcpy(*(void **)(local_18 + 0x18),local_140,0x40);
    break;
  case 0x10:
    memset(local_180,0,0x40);
    memcpy(*(void **)(local_18 + 0x18),local_180,0x40);
    break;
  case 0x11:
    memset(&local_198,0,0x18);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_198;
    puVar1[1] = local_190;
    puVar1[2] = local_188;
    break;
  case 0x12:
    memset(&local_1a0,0,8);
    **(undefined8 **)(local_18 + 0x18) = local_1a0;
    break;
  case 0x13:
    memset(&local_1b0,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_1b0;
    puVar1[1] = local_1a8;
    break;
  case 0x14:
    memset(&local_1c0,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_1c0;
    puVar1[1] = local_1b8;
    break;
  case 0x15:
    memset(&local_1c9,0,9);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_1c9;
    *(undefined1 *)(puVar1 + 1) = local_1c1;
    break;
  case 0x16:
    memset(&local_1d1,0,8);
    **(undefined8 **)(local_18 + 0x18) = local_1d1;
    break;
  case 0x17:
    memset(&local_1d9,0,8);
    **(undefined8 **)(local_18 + 0x18) = local_1d9;
    break;
  case 0x18:
    memset(&local_1e1,0,8);
    **(undefined8 **)(local_18 + 0x18) = local_1e1;
    break;
  case 0x19:
    memset(&local_1f1,0,0x10);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_1f1;
    puVar1[1] = local_1e9;
    break;
  case 0x1a:
    memset(&local_1fd,0,0xc);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_1fd;
    *(undefined4 *)(puVar1 + 1) = local_1f5;
    break;
  case 0x1b:
    memset(&local_209,0,0xc);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_209;
    *(undefined4 *)(puVar1 + 1) = local_201;
    break;
  case 0x1c:
    memset(&local_221,0,0x18);
    puVar1 = *(undefined8 **)(local_18 + 0x18);
    *puVar1 = local_221;
    puVar1[1] = local_219;
    puVar1[2] = local_211;
    break;
  case 0x1e:
    memset(local_260,0,0x38);
    memcpy(*(void **)(local_18 + 0x18),local_260,0x38);
  }
  return 0;
}

Assistant:

static exr_result_t
attr_init (exr_context_t ctxt, exr_attribute_t* nattr)
{
    switch (nattr->type)
    {
        case EXR_ATTR_BOX2I: {
            exr_attr_box2i_t nil = {{0}};
            *(nattr->box2i)      = nil;
            break;
        }
        case EXR_ATTR_BOX2F: {
            exr_attr_box2f_t nil = {{0}};
            *(nattr->box2f)      = nil;
            break;
        }
        case EXR_ATTR_CHLIST: {
            exr_attr_chlist_t nil = {0};
            *(nattr->chlist)      = nil;
            break;
        }
        case EXR_ATTR_CHROMATICITIES: {
            exr_attr_chromaticities_t nil = {0};
            *(nattr->chromaticities)      = nil;
            break;
        }
        case EXR_ATTR_COMPRESSION:
        case EXR_ATTR_ENVMAP:
        case EXR_ATTR_LINEORDER:
        case EXR_ATTR_DEEP_IMAGE_STATE: nattr->uc = 0; break;
        case EXR_ATTR_DOUBLE: nattr->d = 0.0; break;
        case EXR_ATTR_FLOAT: nattr->f = 0.0f; break;
        case EXR_ATTR_FLOAT_VECTOR: {
            exr_attr_float_vector_t nil = {0};
            *(nattr->floatvector)       = nil;
            break;
        }
        case EXR_ATTR_INT: nattr->i = 0; break;
        case EXR_ATTR_KEYCODE: {
            exr_attr_keycode_t nil = {0};
            *(nattr->keycode)      = nil;
            break;
        }
        case EXR_ATTR_M33F: {
            exr_attr_m33f_t nil = {0};
            *(nattr->m33f)      = nil;
            break;
        }
        case EXR_ATTR_M33D: {
            exr_attr_m33d_t nil = {0};
            *(nattr->m33d)      = nil;
            break;
        }
        case EXR_ATTR_M44F: {
            exr_attr_m44f_t nil = {0};
            *(nattr->m44f)      = nil;
            break;
        }
        case EXR_ATTR_M44D: {
            exr_attr_m44f_t nil = {0};
            *(nattr->m44f)      = nil;
            break;
        }
        case EXR_ATTR_PREVIEW: {
            exr_attr_preview_t nil = {0};
            *(nattr->preview)      = nil;
            break;
        }
        case EXR_ATTR_RATIONAL: {
            exr_attr_rational_t nil = {0};
            *(nattr->rational)      = nil;
            break;
        }
        case EXR_ATTR_STRING: {
            exr_attr_string_t nil = {0};
            *(nattr->string)      = nil;
            break;
        }
        case EXR_ATTR_STRING_VECTOR: {
            exr_attr_string_vector_t nil = {0};
            *(nattr->stringvector)       = nil;
            break;
        }
        case EXR_ATTR_TILEDESC: {
            exr_attr_tiledesc_t nil = {0};
            *(nattr->tiledesc)      = nil;
            break;
        }
        case EXR_ATTR_TIMECODE: {
            exr_attr_timecode_t nil = {0};
            *(nattr->timecode)      = nil;
            break;
        }
        case EXR_ATTR_V2I: {
            exr_attr_v2i_t nil = {0};
            *(nattr->v2i)      = nil;
            break;
        }
        case EXR_ATTR_V2F: {
            exr_attr_v2f_t nil = {0};
            *(nattr->v2f)      = nil;
            break;
        }
        case EXR_ATTR_V2D: {
            exr_attr_v2d_t nil = {0};
            *(nattr->v2d)      = nil;
            break;
        }
        case EXR_ATTR_V3I: {
            exr_attr_v3i_t nil = {0};
            *(nattr->v3i)      = nil;
            break;
        }
        case EXR_ATTR_V3F: {
            exr_attr_v3f_t nil = {0};
            *(nattr->v3f)      = nil;
            break;
        }
        case EXR_ATTR_V3D: {
            exr_attr_v3d_t nil = {0};
            *(nattr->v3d)      = nil;
            break;
        }
        case EXR_ATTR_OPAQUE: {
            exr_attr_opaquedata_t nil = {0};
            *(nattr->opaque)          = nil;
            break;
        }
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default:
            if (ctxt)
                ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Invalid / unimplemented type (%s) in attr_init",
                    nattr->type_name);
            return EXR_ERR_INVALID_ARGUMENT;
    }
    return EXR_ERR_SUCCESS;
}